

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipboard.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  char *__ptr;
  size_t sStack_30;
  
  iVar1 = getopt(argc,argv,"h");
  if (iVar1 == -1) {
    glfwSetErrorCallback(error_callback);
    iVar1 = glfwInit();
    if (iVar1 == 0) {
      __ptr = "Failed to initialize GLFW\n";
      sStack_30 = 0x1a;
    }
    else {
      handle = glfwCreateWindow(200,200,"Clipboard Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      if (handle != (GLFWwindow *)0x0) {
        glfwMakeContextCurrent(handle);
        gladLoadGLLoader(glfwGetProcAddress);
        glfwSwapInterval(1);
        glfwSetKeyCallback(handle,key_callback);
        glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
        (*glad_glMatrixMode)(0x1701);
        (*glad_glOrtho)(-1.0,1.0,-1.0,1.0,-1.0,1.0);
        (*glad_glMatrixMode)(0x1700);
        (*glad_glClearColor)(0.5,0.5,0.5,0.0);
        while( true ) {
          iVar1 = glfwWindowShouldClose(handle);
          if (iVar1 != 0) break;
          (*glad_glClear)(0x4000);
          (*glad_glColor3f)(0.8,0.2,0.4);
          (*glad_glRectf)(-0.5,-0.5,0.5,0.5);
          glfwSwapBuffers(handle);
          glfwWaitEvents();
        }
        glfwTerminate();
        goto LAB_00110bcf;
      }
      glfwTerminate();
      __ptr = "Failed to open GLFW window\n";
      sStack_30 = 0x1b;
    }
    fwrite(__ptr,sStack_30,1,_stderr);
  }
  else {
    if (iVar1 == 0x68) {
      usage();
LAB_00110bcf:
      exit(0);
    }
    usage();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch;
    GLFWwindow* window;

    while ((ch = getopt(argc, argv, "h")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
    {
        fprintf(stderr, "Failed to initialize GLFW\n");
        exit(EXIT_FAILURE);
    }

    window = glfwCreateWindow(200, 200, "Clipboard Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();

        fprintf(stderr, "Failed to open GLFW window\n");
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    glfwSetKeyCallback(window, key_callback);
    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);

    glMatrixMode(GL_PROJECTION);
    glOrtho(-1.f, 1.f, -1.f, 1.f, -1.f, 1.f);
    glMatrixMode(GL_MODELVIEW);

    glClearColor(0.5f, 0.5f, 0.5f, 0);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);

        glColor3f(0.8f, 0.2f, 0.4f);
        glRectf(-0.5f, -0.5f, 0.5f, 0.5f);

        glfwSwapBuffers(window);
        glfwWaitEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}